

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

void Curl_freeset(Curl_easy *data)

{
  undefined1 *puVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    (*Curl_cfree)((data->set).str[lVar2]);
    (data->set).str[lVar2] = (char *)0x0;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x40);
  if (((data->change).field_0x20 & 2) != 0) {
    (*Curl_cfree)((data->change).referer);
    (data->change).referer = (char *)0x0;
    puVar1 = &(data->change).field_0x20;
    *puVar1 = *puVar1 & 0xfd;
  }
  (data->change).referer = (char *)0x0;
  if (((data->change).field_0x20 & 1) != 0) {
    (*Curl_cfree)((data->change).url);
    (data->change).url = (char *)0x0;
    puVar1 = &(data->change).field_0x20;
    *puVar1 = *puVar1 & 0xfe;
  }
  (data->change).url = (char *)0x0;
  Curl_mime_cleanpart(&(data->set).mimepost);
  return;
}

Assistant:

void Curl_freeset(struct Curl_easy *data)
{
  /* Free all dynamic strings stored in the data->set substructure. */
  enum dupstring i;
  for(i = (enum dupstring)0; i < STRING_LAST; i++) {
    Curl_safefree(data->set.str[i]);
  }

  if(data->change.referer_alloc) {
    Curl_safefree(data->change.referer);
    data->change.referer_alloc = FALSE;
  }
  data->change.referer = NULL;
  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }
  data->change.url = NULL;

  Curl_mime_cleanpart(&data->set.mimepost);
}